

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

quint64 extendedPseudoClass(QWidget *w)

{
  bool bVar1;
  Orientation OVar2;
  QAbstractSlider *pQVar3;
  ulong uVar4;
  QComboBox *pQVar5;
  QLineEdit *pQVar6;
  QTextEdit *this;
  QPlainTextEdit *pQVar7;
  QPlainTextEdit *edit_2;
  QTextEdit *edit_1;
  QLineEdit *edit;
  QComboBox *combo;
  QAbstractSlider *slider;
  quint64 pc;
  QWidget *in_stack_ffffffffffffffd0;
  ulong local_10;
  
  bVar1 = QWidget::isWindow(in_stack_ffffffffffffffd0);
  local_10 = 0;
  if (bVar1) {
    local_10 = 0x1000;
  }
  pQVar3 = qobject_cast<QAbstractSlider_const*>((QObject *)0x4298a2);
  if (pQVar3 == (QAbstractSlider *)0x0) {
    pQVar5 = qobject_cast<QComboBox_const*>((QObject *)0x4298e5);
    if (pQVar5 == (QComboBox *)0x0) {
      pQVar6 = qobject_cast<QLineEdit_const*>((QObject *)0x42993d);
      if (pQVar6 == (QLineEdit *)0x0) {
        this = qobject_cast<QTextEdit_const*>((QObject *)0x429985);
        if (this == (QTextEdit *)0x0) {
          pQVar7 = qobject_cast<QPlainTextEdit_const*>((QObject *)0x4299ca);
          if (pQVar7 != (QPlainTextEdit *)0x0) {
            bVar1 = QPlainTextEdit::isReadOnly((QPlainTextEdit *)this);
            uVar4 = 0x8000000000;
            if (bVar1) {
              uVar4 = 0x40000000;
            }
            local_10 = uVar4 | local_10;
          }
        }
        else {
          bVar1 = QTextEdit::isReadOnly(this);
          uVar4 = 0x8000000000;
          if (bVar1) {
            uVar4 = 0x40000000;
          }
          local_10 = uVar4 | local_10;
        }
      }
      else {
        bVar1 = QLineEdit::isReadOnly((QLineEdit *)in_stack_ffffffffffffffd0);
        uVar4 = 0x8000000000;
        if (bVar1) {
          uVar4 = 0x40000000;
        }
        local_10 = uVar4 | local_10;
      }
    }
    else {
      bVar1 = QComboBox::isEditable((QComboBox *)in_stack_ffffffffffffffd0);
      if (bVar1) {
        bVar1 = QComboBox::isEditable((QComboBox *)in_stack_ffffffffffffffd0);
        uVar4 = 0x40000000;
        if (bVar1) {
          uVar4 = 0x8000000000;
        }
        local_10 = uVar4 | local_10;
      }
    }
  }
  else {
    OVar2 = QAbstractSlider::orientation((QAbstractSlider *)in_stack_ffffffffffffffd0);
    uVar4 = 0x400;
    if (OVar2 == Vertical) {
      uVar4 = 0x800;
    }
    local_10 = uVar4 | local_10;
  }
  return local_10;
}

Assistant:

static quint64 extendedPseudoClass(const QWidget *w)
{
    quint64 pc = w->isWindow() ? quint64(PseudoClass_Window) : 0;
#if QT_CONFIG(abstractslider)
    if (const QAbstractSlider *slider = qobject_cast<const QAbstractSlider *>(w)) {
        pc |= ((slider->orientation() == Qt::Vertical) ? PseudoClass_Vertical : PseudoClass_Horizontal);
    } else
#endif
#if QT_CONFIG(combobox)
    if (const QComboBox *combo = qobject_cast<const QComboBox *>(w)) {
        if (combo->isEditable())
        pc |= (combo->isEditable() ? PseudoClass_Editable : PseudoClass_ReadOnly);
    } else
#endif
#if QT_CONFIG(lineedit)
    if (const QLineEdit *edit = qobject_cast<const QLineEdit *>(w)) {
        pc |= (edit->isReadOnly() ? PseudoClass_ReadOnly : PseudoClass_Editable);
    } else
#endif
#if QT_CONFIG(textedit)
    if (const QTextEdit *edit = qobject_cast<const QTextEdit *>(w)) {
        pc |= (edit->isReadOnly() ? PseudoClass_ReadOnly : PseudoClass_Editable);
    } else
    if (const QPlainTextEdit *edit = qobject_cast<const QPlainTextEdit *>(w)) {
        pc |= (edit->isReadOnly() ? PseudoClass_ReadOnly : PseudoClass_Editable);
    } else
#endif
    {}
    return pc;
}